

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

void __thiscall fasttext::DenseMatrix::addRowToVector(DenseMatrix *this,Vector *x,int32_t i)

{
  size_t sVar1;
  float *pfVar2;
  int64_t iVar3;
  size_t sVar4;
  real *prVar5;
  int64_t j;
  long j_00;
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x88,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const");
  }
  iVar3 = Matrix::size(&this->super_Matrix,0);
  if ((long)(ulong)(uint)i < iVar3) {
    sVar1 = (x->data_).size_;
    sVar4 = Matrix::size(&this->super_Matrix,1);
    if (sVar1 == sVar4) {
      for (j_00 = 0; j_00 < (this->super_Matrix).n_; j_00 = j_00 + 1) {
        prVar5 = at(this,(ulong)(uint)i,j_00);
        pfVar2 = (x->data_).mem_;
        pfVar2[j_00] = *prVar5 + pfVar2[j_00];
      }
      return;
    }
    __assert_fail("x.size() == this->size(1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x8a,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const");
  }
  __assert_fail("i < this->size(0)",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                ,0x89,"virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const")
  ;
}

Assistant:

void DenseMatrix::addRowToVector(Vector& x, int32_t i) const {
  assert(i >= 0);
  assert(i < this->size(0));
  assert(x.size() == this->size(1));
  for (int64_t j = 0; j < n_; j++) {
    x[j] += at(i, j);
  }
}